

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

char * __thiscall tinyxml2::XMLComment::ParseDeep(XMLComment *this,char *p,StrPair *param_2)

{
  XMLDocument *pXVar1;
  char *pcVar2;
  
  pcVar2 = StrPair::ParseText(&(this->super_XMLNode)._value,p,"-->",2);
  if (pcVar2 == (char *)0x0) {
    pXVar1 = (this->super_XMLNode)._document;
    pXVar1->_errorID = XML_ERROR_PARSING_COMMENT;
    pXVar1->_errorStr1 = p;
    pXVar1->_errorStr2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char* XMLComment::ParseDeep( char* p, StrPair* )
{
    // Comment parses as text.
    const char* start = p;
    p = _value.ParseText( p, "-->", StrPair::COMMENT );
    if ( p == 0 ) {
        _document->SetError( XML_ERROR_PARSING_COMMENT, start, 0 );
    }
    return p;
}